

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O0

void P_DisconnectEffect(AActor *actor)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  particle_t *this;
  int local_54;
  undefined1 local_50 [8];
  DVector3 pos;
  double zo;
  double yo;
  double xo;
  particle_t *p;
  int i;
  AActor *actor_local;
  
  if (actor != (AActor *)0x0) {
    p._4_4_ = 0x40;
    while ((p._4_4_ != 0 && (this = JitterParticle(0x46), this != (particle_t *)0x0))) {
      iVar3 = FRandom::operator()(&M_Random);
      dVar1 = actor->radius;
      iVar4 = FRandom::operator()(&M_Random);
      dVar2 = actor->radius;
      iVar5 = FRandom::operator()(&M_Random);
      pos.Z = ((double)iVar5 * actor->Height) / 256.0;
      AActor::Vec3Offset((DVector3 *)local_50,actor,((double)(iVar3 + -0x80) * dVar1) / 128.0,
                         ((double)(iVar4 + -0x80) * dVar2) / 128.0,pos.Z,false);
      TVector3<double>::operator=(&this->Pos,(TVector3<double> *)local_50);
      (this->Acc).Z = (this->Acc).Z - 0.000244140625;
      iVar3 = FRandom::operator()(&M_Random);
      if (iVar3 < 0x80) {
        local_54 = maroon1;
      }
      else {
        local_54 = maroon2;
      }
      this->color = local_54;
      this->size = 4.0;
      p._4_4_ = p._4_4_ + -1;
    }
  }
  return;
}

Assistant:

void P_DisconnectEffect (AActor *actor)
{
	int i;

	if (actor == NULL)
		return;

	for (i = 64; i; i--)
	{
		particle_t *p = JitterParticle (TICRATE*2);

		if (!p)
			break;

		double xo = (M_Random() - 128)*actor->radius / 128;
		double yo = (M_Random() - 128)*actor->radius / 128;
		double zo = M_Random()*actor->Height / 256;

		DVector3 pos = actor->Vec3Offset(xo, yo, zo);
		p->Pos = pos;
		p->Acc.Z -= 1./4096;
		p->color = M_Random() < 128 ? maroon1 : maroon2;
		p->size = 4;
	}
}